

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstate.c
# Opt level: O2

lua_State * lua_newthread(lua_State *L)

{
  int iVar1;
  global_State *g;
  StkId pSVar2;
  undefined4 uVar3;
  lua_State *L_00;
  lua_State *x_;
  
  g = L->l_G;
  if (0 < g->GCdebt) {
    luaC_step(L);
  }
  L_00 = (lua_State *)luaC_newobjdt(L,8,0xd0,8);
  pSVar2 = (L->top).p;
  *(lua_State **)pSVar2 = L_00;
  (pSVar2->val).tt_ = 'H';
  (L->top).p = (StkId)((L->top).offset + 0x10);
  preinit_thread(L_00,g);
  L_00->hookmask = L->hookmask;
  iVar1 = L->basehookcount;
  L_00->basehookcount = iVar1;
  L_00->hook = L->hook;
  L_00->hookcount = iVar1;
  uVar3 = *(undefined4 *)&g->mainthread[-1].field_0xc4;
  L_00[-1].hookmask = g->mainthread[-1].hookmask;
  *(undefined4 *)&L_00[-1].field_0xc4 = uVar3;
  stack_init(L_00,L);
  return L_00;
}

Assistant:

LUA_API lua_State *lua_newthread (lua_State *L) {
  global_State *g = G(L);
  GCObject *o;
  lua_State *L1;
  lua_lock(L);
  luaC_checkGC(L);
  /* create new thread */
  o = luaC_newobjdt(L, LUA_TTHREAD, sizeof(LX), offsetof(LX, l));
  L1 = gco2th(o);
  /* anchor it on L stack */
  setthvalue2s(L, L->top.p, L1);
  api_incr_top(L);
  preinit_thread(L1, g);
  L1->hookmask = L->hookmask;
  L1->basehookcount = L->basehookcount;
  L1->hook = L->hook;
  resethookcount(L1);
  /* initialize L1 extra space */
  memcpy(lua_getextraspace(L1), lua_getextraspace(g->mainthread),
         LUA_EXTRASPACE);
  luai_userstatethread(L, L1);
  stack_init(L1, L);  /* init stack */
  lua_unlock(L);
  return L1;
}